

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_ListFieldsSorted_Test::TestBody
          (GeneratedMessageReflection_ListFieldsSorted_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Matcher<const_int_&> *this_00;
  AssertHelperData *this_01;
  int number;
  string *this_02;
  Arena *arena;
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  *pPVar4;
  Reflection *this_03;
  ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
  *matcher;
  ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
  *matcher_00;
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  *in_R8;
  char *pcVar5;
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  *in_R9;
  string_view value;
  Metadata MVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  TestFieldOrderings msg;
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  local_948;
  int local_8fc;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_8f8;
  int local_8e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d8;
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  local_8d0;
  undefined1 local_888 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_880;
  MatcherBase<const_int_&> local_878;
  _Alloc_hider local_860;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_850;
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  local_840;
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  local_7f8;
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  local_7b0;
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  local_768;
  undefined1 local_648 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_640;
  MatcherBase<const_int_&> local_638;
  _Alloc_hider local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_610;
  undefined1 local_600 [40];
  _Alloc_hider local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8 [2];
  MatcherBase<const_int_&> local_5a8;
  _Alloc_hider local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580 [10];
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  local_4e0;
  MatcherBase<const_int_&> local_498;
  int local_47c [3];
  undefined1 local_470 [48];
  ArenaStringPtr local_440 [4];
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  local_420;
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  local_390;
  ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
  local_300;
  ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
  local_228;
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  local_150;
  
  proto2_unittest::TestFieldOrderings::TestFieldOrderings
            ((TestFieldOrderings *)local_470,(Arena *)0x0);
  MVar6 = proto2_unittest::TestFieldOrderings::GetMetadata
                    ((TestFieldOrderings *)proto2_unittest::_TestFieldOrderings_default_instance_);
  this_03 = MVar6.reflection;
  local_470[0x28] = local_470[0x28] | 1;
  local_8f8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arena = (Arena *)local_470._8_8_;
  if ((local_470._8_8_ & 1) != 0) {
    arena = *(Arena **)(local_470._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "hello";
  value._M_len = 5;
  protobuf::internal::ArenaStringPtr::Set(local_440,value,arena);
  local_470[0x28] = local_470[0x28] | 2;
  if (local_440[1].tagged_ptr_.ptr_ == (void *)0x0) {
    if ((local_470._8_8_ & 1) != 0) {
      local_470._8_8_ = *(undefined8 *)(local_470._8_8_ & 0xfffffffffffffffe);
    }
    local_440[1].tagged_ptr_.ptr_ =
         (TaggedStringPtr)
         Arena::DefaultConstruct<proto2_unittest::TestFieldOrderings_NestedMessage>
                   ((Arena *)local_470._8_8_);
  }
  Reflection::ListFields(this_03,(Message *)local_470,&local_8f8);
  local_4e0.matcher_.impl_.property_._0_4_ = 0xb;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_948,(int *)&local_4e0);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_7f8,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  paVar1 = &local_768.
            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
            .
            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
            .
            super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
            .
            super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
            ._M_head_impl.matcher_.impl_.whose_property_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_948);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_7b0,&local_7f8);
  local_648._0_4_ = 200;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_8d0,(int *)local_648);
  pPVar4 = &local_8d0;
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_840,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_8d0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_948,&local_840);
  testing::
  ElementsAre<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>
            ((ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
              *)&local_390,(testing *)&local_7b0,&local_948,pPVar4);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)&local_768,&local_390);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)local_600,
                (_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)&local_768);
  paVar2 = &local_768.
            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
            .
            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
            .
            super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
            ._M_head_impl.matcher_.impl_.whose_property_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar2) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
  ::operator()(local_888,local_600,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)0x13ef519);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_p != local_580) {
    operator_delete(local_590._M_p,local_580[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.
         super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_390.
       super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_390.
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_390.
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_390.
              super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_390.
       super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_390.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_390.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_390.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_948.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_948.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_948.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_948.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840.impl_.whose_property_._M_dataplus._M_p !=
      &local_840.impl_.whose_property_.field_2) {
    operator_delete(local_840.impl_.whose_property_._M_dataplus._M_p,
                    local_840.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_840.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_7b0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_7b0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7b0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8.impl_.whose_property_._M_dataplus._M_p !=
      &local_7f8.impl_.whose_property_.field_2) {
    operator_delete(local_7f8.impl_.whose_property_._M_dataplus._M_p,
                    local_7f8.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7f8.impl_.matcher_.super_MatcherBase<const_int_&>);
  if (local_888[0] == '\0') {
    testing::Message::Message((Message *)&local_768);
    if (local_880 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      in_R8 = (PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
               *)(anon_var_dwarf_a22956 + 5);
    }
    else {
      in_R8 = (PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
               *)(local_880->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6ea,(char *)in_R8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_600,(Message *)&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_600);
    if ((long *)local_768.
                super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                ._M_head_impl.matcher_.impl_.property_ != (long *)0x0) {
      (**(code **)(*(long *)local_768.
                            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                            ._M_head_impl.matcher_.impl_.property_ + 8))();
    }
  }
  if (local_880 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_880,local_880);
  }
  local_440[2].tagged_ptr_.ptr_ = (TaggedStringPtr)(void *)0x1092;
  local_470[0x28] = local_470[0x28] | 4;
  Reflection::ListFields(this_03,(Message *)local_470,&local_8f8);
  local_498.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_4_ = 1;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_948,(int *)&local_498);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)local_600,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_7f8,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_948);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_7b0,&local_7f8);
  local_8e0[0] = 0xb;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_8d0,local_8e0);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)local_600,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_840,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_8d0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_948,&local_840);
  local_8fc = 200;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_4e0,&local_8fc);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)local_600,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
              *)local_888,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_4e0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_8d0,
                   (PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
                    *)local_888);
  testing::
  ElementsAre<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>
            (&local_228,(testing *)&local_7b0,&local_948,&local_8d0,in_R8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>_>
              *)&local_768,(internal *)&local_228,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
  ::operator()(local_648,(char *)&local_768,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)0x13ef519);
  paVar3 = &local_768.
            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
            .
            super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
            ._M_head_impl.matcher_.impl_.whose_property_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar3) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar2) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.matchers_.
         super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_228.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_228.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_228.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_228.matchers_.
              super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.matchers_.
         super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_228.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_228.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_228.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_228.matchers_.
              super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.matchers_.
         super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_228.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_228.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_228.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_228.matchers_.
              super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_8d0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_8d0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_8d0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_8d0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_p != &local_850) {
    operator_delete(local_860._M_p,local_850._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_878);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_948.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_948.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_948.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_948.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840.impl_.whose_property_._M_dataplus._M_p !=
      &local_840.impl_.whose_property_.field_2) {
    operator_delete(local_840.impl_.whose_property_._M_dataplus._M_p,
                    local_840.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_840.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_7b0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_7b0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7b0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8.impl_.whose_property_._M_dataplus._M_p !=
      &local_7f8.impl_.whose_property_.field_2) {
    operator_delete(local_7f8.impl_.whose_property_._M_dataplus._M_p,
                    local_7f8.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7f8.impl_.matcher_.super_MatcherBase<const_int_&>);
  if (local_648[0] == '\0') {
    testing::Message::Message((Message *)&local_768);
    if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_640->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6f1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_600,(Message *)&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_600);
    if ((long *)local_768.
                super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                ._M_head_impl.matcher_.impl_.property_ != (long *)0x0) {
      (**(code **)(*(long *)local_768.
                            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                            ._M_head_impl.matcher_.impl_.property_ + 8))();
    }
  }
  if (local_640 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_640,local_640);
  }
  if (local_440[1].tagged_ptr_.ptr_ != (void *)0x0) {
    proto2_unittest::TestFieldOrderings_NestedMessage::Clear
              ((TestFieldOrderings_NestedMessage *)local_440[1].tagged_ptr_.ptr_);
  }
  local_470[0x28] = local_470[0x28] & 0xfd;
  pPVar4 = (PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
            *)0x0;
  protobuf::internal::ExtensionSet::SetInt32
            ((ExtensionSet *)(local_470 + 0x10),proto2_unittest::my_extension_int,'\x05',0x67932,
             (FieldDescriptor *)0x0);
  Reflection::ListFields(this_03,(Message *)local_470,&local_8f8);
  local_498.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_4_ = 1;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_948,(int *)&local_498);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)local_600,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_7f8,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_948);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_7b0,&local_7f8);
  local_8e0[0] = 5;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_8d0,local_8e0);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)local_600,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_840,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_8d0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_948,&local_840);
  local_8fc = 0xb;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_4e0,&local_8fc);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)local_600,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
              *)local_888,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_600 + 0x10));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_4e0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_8d0,
                   (PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
                    *)local_888);
  testing::
  ElementsAre<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>
            (&local_300,(testing *)&local_7b0,&local_948,&local_8d0,pPVar4);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>_>
              *)&local_768,(internal *)&local_300,matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
  ::operator()(local_648,(char *)&local_768,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)0x13ef519);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar3) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar2) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.matchers_.
         super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_300.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_300.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_300.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_300.matchers_.
              super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.matchers_.
         super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_300.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_300.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_300.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_300.matchers_.
              super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.matchers_.
         super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_300.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_300.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_300.matchers_.
                    super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_300.matchers_.
              super__Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_8d0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_8d0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_8d0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_8d0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_p != &local_850) {
    operator_delete(local_860._M_p,local_850._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_878);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_948.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_948.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_948.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_948.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840.impl_.whose_property_._M_dataplus._M_p !=
      &local_840.impl_.whose_property_.field_2) {
    operator_delete(local_840.impl_.whose_property_._M_dataplus._M_p,
                    local_840.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_840.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_7b0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_7b0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7b0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8.impl_.whose_property_._M_dataplus._M_p !=
      &local_7f8.impl_.whose_property_.field_2) {
    operator_delete(local_7f8.impl_.whose_property_._M_dataplus._M_p,
                    local_7f8.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7f8.impl_.matcher_.super_MatcherBase<const_int_&>);
  if (local_648[0] == '\0') {
    testing::Message::Message((Message *)&local_768);
    if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_640->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6fa,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_600,(Message *)&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_600);
    if ((long *)local_768.
                super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                ._M_head_impl.matcher_.impl_.property_ != (long *)0x0) {
      (**(code **)(*(long *)local_768.
                            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                            ._M_head_impl.matcher_.impl_.property_ + 8))();
    }
  }
  if (local_640 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_640,local_640);
  }
  protobuf::internal::ArenaStringPtr::ClearToEmpty(local_440);
  local_470[0x28] = local_470[0x28] & 0xfe;
  Reflection::ListFields(this_03,(Message *)local_470,&local_8f8);
  local_4e0.matcher_.impl_.property_._0_4_ = 1;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_948,(int *)&local_4e0);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_7f8,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_948);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_7b0,&local_7f8);
  local_648._0_4_ = 5;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_8d0,(int *)local_648);
  pPVar4 = &local_8d0;
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_840,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_8d0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_948,&local_840);
  testing::
  ElementsAre<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>
            ((ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
              *)&local_420,(testing *)&local_7b0,&local_948,pPVar4);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)&local_768,&local_420);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)local_600,
                (_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar2) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  this_00 = &local_768.
             super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
             .
             super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
             .
             super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
             .
             super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
             ._M_head_impl.matcher_.impl_.matcher_;
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&this_00->super_MatcherBase<const_int_&>);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
  ::operator()(local_888,local_600,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)0x13ef519);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_p != local_580) {
    operator_delete(local_590._M_p,local_580[0]._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_p != local_5c8) {
    operator_delete(local_5d8._M_p,local_5c8[0]._M_allocated_capacity + 1);
  }
  this_01 = (AssertHelperData *)(local_600 + 0x10);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.
         super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_420.
       super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_420.
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_420.
                    super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_420.
              super__Head_base<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_420.
       super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
       .
       super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
       ._M_head_impl.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_420.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_420.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_420.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_948.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_948.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_948.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_948.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840.impl_.whose_property_._M_dataplus._M_p !=
      &local_840.impl_.whose_property_.field_2) {
    operator_delete(local_840.impl_.whose_property_._M_dataplus._M_p,
                    local_840.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_840.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_7b0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_7b0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7b0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8.impl_.whose_property_._M_dataplus._M_p !=
      &local_7f8.impl_.whose_property_.field_2) {
    operator_delete(local_7f8.impl_.whose_property_._M_dataplus._M_p,
                    local_7f8.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7f8.impl_.matcher_.super_MatcherBase<const_int_&>);
  if (local_888[0] == '\0') {
    testing::Message::Message((Message *)&local_768);
    if (local_880 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_880->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x700,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_600,(Message *)&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_600);
    if ((long *)local_768.
                super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                .
                super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                ._M_head_impl.matcher_.impl_.property_ != (long *)0x0) {
      (**(code **)(*(long *)local_768.
                            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                            ._M_head_impl.matcher_.impl_.property_ + 8))();
    }
  }
  if (local_880 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_880,local_880);
  }
  local_440[3].tagged_ptr_.ptr_._0_4_ = 1.0;
  local_470[0x28] = local_470[0x28] | 8;
  local_600._0_8_ = this_01;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"hello","");
  number = proto2_unittest::my_extension_string;
  local_768.
  super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  .
  super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  .
  super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  .
  super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
  ._M_head_impl.matcher_.impl_.property_ = (offset_in_FieldDescriptor_to_subr)this_00;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_768,local_600._0_8_,
             (long)&((MatcherDescriberInterface *)local_600._0_8_)->_vptr_MatcherDescriberInterface
             + local_600._8_8_);
  this_02 = protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
                      ((ExtensionSet *)(local_470 + 0x10),number,'\f',(FieldDescriptor *)0x0);
  std::__cxx11::string::operator=((string *)this_02,(string *)&local_768);
  if ((Matcher<const_int_&> *)
      local_768.
      super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
      .
      super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
      .
      super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
      .
      super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
      ._M_head_impl.matcher_.impl_.property_ != this_00) {
    operator_delete((void *)local_768.
                            super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                            .
                            super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                            ._M_head_impl.matcher_.impl_.property_,
                    (long)local_768.
                          super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                          .
                          super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                          .
                          super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                          ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>.
                          super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 1);
  }
  if ((AssertHelperData *)local_600._0_8_ != this_01) {
    operator_delete((void *)local_600._0_8_,local_600._16_8_ + 1);
  }
  Reflection::ListFields(this_03,(Message *)local_470,&local_8f8);
  local_8fc = 1;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_948,&local_8fc);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_7f8,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_948);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_7b0,&local_7f8);
  local_47c[2] = 5;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_8d0,local_47c + 2);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            (&local_840,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_8d0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_948,&local_840);
  local_47c[1] = 0x32;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_4e0,local_47c + 1);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
              *)local_888,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_4e0);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_8d0,
                   (PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
                    *)local_888);
  local_47c[0] = 0x65;
  testing::Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_498,local_47c);
  testing::internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::PropertyMatcher((PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
                     *)&local_768,0x73bfee,(Matcher<const_int_&> *)0x0);
  testing::
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  ::PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
              *)local_648,
             (PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
              *)&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_768.
                    super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                    .
                    super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
                    ._M_head_impl.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_768.
              super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
              .
              super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
              ._M_head_impl.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_498);
  testing::internal::
  PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>
  ::PointeeMatcher(&local_4e0,
                   (PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
                    *)local_648);
  testing::
  ElementsAre<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>
            ((ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>_>
              *)&local_150,(testing *)&local_7b0,&local_948,&local_8d0,&local_4e0,in_R9);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::_Tuple_impl(&local_768,&local_150);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                 *)local_600,&local_768);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::~_Tuple_impl(&local_768);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>,testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,int,int(google::protobuf::FieldDescriptor::*)()const>>>>>>
  ::operator()(local_8e0,local_600,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)0x13ef519);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
                  *)local_600);
  std::
  _Tuple_impl<0UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
  ::~_Tuple_impl(&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_4e0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_4e0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_4e0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_4e0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_p != &local_610) {
    operator_delete(local_620._M_p,local_610._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_8d0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_8d0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_8d0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_8d0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_p != &local_850) {
    operator_delete(local_860._M_p,local_850._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_878);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_948.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_948.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_948.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_948.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840.impl_.whose_property_._M_dataplus._M_p !=
      &local_840.impl_.whose_property_.field_2) {
    operator_delete(local_840.impl_.whose_property_._M_dataplus._M_p,
                    local_840.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_840.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p !=
      &local_7b0.matcher_.impl_.whose_property_.field_2) {
    operator_delete(local_7b0.matcher_.impl_.whose_property_._M_dataplus._M_p,
                    local_7b0.matcher_.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7b0.matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8.impl_.whose_property_._M_dataplus._M_p !=
      &local_7f8.impl_.whose_property_.field_2) {
    operator_delete(local_7f8.impl_.whose_property_._M_dataplus._M_p,
                    local_7f8.impl_.whose_property_.field_2._M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&local_7f8.impl_.matcher_.super_MatcherBase<const_int_&>);
  if ((char)local_8e0[0] == '\0') {
    testing::Message::Message((Message *)&local_768);
    if (local_8d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_8d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x70a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_600,(Message *)&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_600);
    if ((Matcher<const_int_&> *)
        local_768.
        super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
        .
        super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
        .
        super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
        .
        super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
        ._M_head_impl.matcher_.impl_.property_ != (Matcher<const_int_&> *)0x0) {
      (*(((MatcherBase<const_int_&> *)
         local_768.
         super__Tuple_impl<1UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<2UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Tuple_impl<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>
         .
         super__Head_base<3UL,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_false>
         ._M_head_impl.matcher_.impl_.property_)->super_MatcherDescriberInterface).
        _vptr_MatcherDescriberInterface[1])();
    }
  }
  if (local_8d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_8d8,local_8d8);
  }
  if (local_8f8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8f8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8f8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8f8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  proto2_unittest::TestFieldOrderings::~TestFieldOrderings((TestFieldOrderings *)local_470);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, ListFieldsSorted) {
  unittest::TestFieldOrderings msg;
  const Reflection* reflection = msg.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  msg.set_my_string("hello");             // tag 11
  msg.mutable_optional_nested_message();  // tag 200
  reflection->ListFields(msg, &fields);
  // No sorting, in order declaration.
  EXPECT_THAT(fields,
              ElementsAre(Pointee(Property(&FieldDescriptor::number, 11)),
                          Pointee(Property(&FieldDescriptor::number, 200))));
  msg.set_my_int(4242);  // tag 1
  reflection->ListFields(msg, &fields);
  // Sorting as fields are declared in order 11, 1, 200.
  EXPECT_THAT(fields,
              ElementsAre(Pointee(Property(&FieldDescriptor::number, 1)),
                          Pointee(Property(&FieldDescriptor::number, 11)),
                          Pointee(Property(&FieldDescriptor::number, 200))));
  msg.clear_optional_nested_message();  // tag 200
  msg.SetExtension(unittest::my_extension_int,
                   424242);  // tag 5 from extension
  reflection->ListFields(msg, &fields);
  // Sorting as extension tag is in between.
  EXPECT_THAT(fields,
              ElementsAre(Pointee(Property(&FieldDescriptor::number, 1)),
                          Pointee(Property(&FieldDescriptor::number, 5)),
                          Pointee(Property(&FieldDescriptor::number, 11))));
  msg.clear_my_string();  // tag 11.
  reflection->ListFields(msg, &fields);
  // No sorting as extension is bigger than tag 1.
  EXPECT_THAT(fields,
              ElementsAre(Pointee(Property(&FieldDescriptor::number, 1)),
                          Pointee(Property(&FieldDescriptor::number, 5))));
  msg.set_my_float(1.0);  // tag 101
  msg.SetExtension(unittest::my_extension_string,
                   "hello");  // tag 50 from extension
  reflection->ListFields(msg, &fields);
  // Sorting of all as extensions are out of order and fields are in between.
  EXPECT_THAT(fields,
              ElementsAre(Pointee(Property(&FieldDescriptor::number, 1)),
                          Pointee(Property(&FieldDescriptor::number, 5)),
                          Pointee(Property(&FieldDescriptor::number, 50)),
                          Pointee(Property(&FieldDescriptor::number, 101))));
}